

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_add_many(roaring_bitmap_t *r,size_t n_args,uint32_t *vals)

{
  roaring_bulk_context_t *context_00;
  uint8_t *in_RDX;
  long in_RSI;
  roaring_bitmap_t *in_RDI;
  roaring_bulk_context_t context;
  container_t *container;
  int idx;
  uint8_t typecode;
  uint32_t *current_val;
  uint32_t *end;
  uint32_t *start;
  uint32_t val;
  undefined4 in_stack_ffffffffffffffb4;
  undefined1 uVar1;
  uint32_t val_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint8_t *local_38;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  
  uVar1 = (undefined1)((uint)in_stack_ffffffffffffffb4 >> 0x18);
  if (in_RSI != 0) {
    uVar2 = *(undefined4 *)in_RDX;
    context_00 = (roaring_bulk_context_t *)
                 containerptr_roaring_bitmap_add
                           (in_RDI,(uint32_t)((ulong)in_RSI >> 0x20),in_RDX,
                            (int *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
    val_00 = CONCAT13(uVar1,CONCAT12((char)((uint)in_stack_ffffffffffffffc4 >> 0x18),
                                     (short)((uint)uVar2 >> 0x10)));
    for (local_38 = in_RDX; local_38 != in_RDX + in_RSI * 4; local_38 = local_38 + 4) {
      add_bulk_impl((roaring_bitmap_t *)
                    CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),context_00,val_00)
      ;
    }
  }
  return;
}

Assistant:

void roaring_bitmap_add_many(roaring_bitmap_t *r, size_t n_args,
                             const uint32_t *vals) {
    uint32_t val;
    const uint32_t *start = vals;
    const uint32_t *end = vals + n_args;
    const uint32_t *current_val = start;

    if (n_args == 0) {
        return;
    }

    uint8_t typecode;
    int idx;
    container_t *container;
    val = *current_val;
    container = containerptr_roaring_bitmap_add(r, val, &typecode, &idx);
    roaring_bulk_context_t context = {container, idx, (uint16_t)(val >> 16),
                                      typecode};

    for (; current_val != end; current_val++) {
        memcpy(&val, current_val, sizeof(val));
        add_bulk_impl(r, &context, val);
    }
}